

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

int compare_rd_idx_pair(void *a,void *b)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  lVar3 = *(long *)((long)b + 8);
  lVar4 = *(long *)((long)a + 8);
  bVar7 = SBORROW8(lVar4,lVar3);
  bVar6 = lVar4 - lVar3 < 0;
  bVar5 = lVar4 == lVar3;
  if (bVar5) {
    iVar1 = *b;
    iVar2 = *a;
    bVar7 = SBORROW4(iVar2,iVar1);
    bVar6 = iVar2 - iVar1 < 0;
    bVar5 = iVar2 == iVar1;
    if (bVar5) {
      return 0;
    }
  }
  return (uint)(!bVar5 && bVar7 == bVar6) * 2 + -1;
}

Assistant:

static int compare_rd_idx_pair(const void *a, const void *b) {
  if (((RdIdxPair *)a)->rd == ((RdIdxPair *)b)->rd) {
    // To avoid inconsistency in qsort() ordering when two elements are equal,
    // using idx as tie breaker. Refer aomedia:2928
    if (((RdIdxPair *)a)->idx == ((RdIdxPair *)b)->idx)
      return 0;
    else if (((RdIdxPair *)a)->idx > ((RdIdxPair *)b)->idx)
      return 1;
    else
      return -1;
  } else if (((const RdIdxPair *)a)->rd > ((const RdIdxPair *)b)->rd) {
    return 1;
  } else {
    return -1;
  }
}